

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O3

bool __thiscall
QWidgetTextControl::setFocusToAnchor(QWidgetTextControl *this,QTextCursor *newCursor)

{
  long lVar1;
  MoveMode MVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QRectF local_98;
  QString local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((*(byte *)(lVar1 + 0xb0) & 8) == 0) {
    bVar4 = false;
  }
  else {
    local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QWidgetTextControlPrivate::anchorForCursor
              (&local_78,(QWidgetTextControlPrivate *)newCursor,newCursor);
    bVar4 = (undefined1 *)local_78.d.size != (undefined1 *)0x0;
    if (bVar4) {
      local_98.w = -NAN;
      local_98.h = -NAN;
      local_98.xp = -NAN;
      local_98.yp = -NAN;
      selectionRect(&local_98,this,(QTextCursor *)(*(long *)(this + 8) + 0x88));
      local_58.xp = 0.0;
      local_58.yp = (qreal)&local_98;
      QMetaObject::activate((QObject *)this,&staticMetaObject,7,(void **)&local_58);
      iVar3 = (int)lVar1 + 0x88;
      MVar2 = QTextCursor::selectionStart();
      QTextCursor::setPosition(iVar3,MVar2);
      MVar2 = QTextCursor::selectionEnd();
      QTextCursor::setPosition(iVar3,MVar2);
      *(undefined1 *)(lVar1 + 0x90) = 1;
      selectionRect(&local_58,this,(QTextCursor *)(*(long *)(this + 8) + 0x88));
      local_98.w = local_58.w;
      local_98.h = local_58.h;
      local_98.xp = local_58.xp;
      local_98.yp = local_58.yp;
      local_58.xp = 0.0;
      local_58.yp = (qreal)&local_98;
      QMetaObject::activate((QObject *)this,&staticMetaObject,7,(void **)&local_58);
      local_58.xp = 0.0;
      local_58.yp = (qreal)&local_98;
      QMetaObject::activate((QObject *)this,&staticMetaObject,0xb,(void **)&local_58);
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControl::setFocusToAnchor(const QTextCursor &newCursor)
{
    Q_D(QWidgetTextControl);

    if (!(d->interactionFlags & Qt::LinksAccessibleByKeyboard))
        return false;

    // Verify that this is an anchor.
    const QString anchorHref = d->anchorForCursor(newCursor);
    if (anchorHref.isEmpty())
        return false;

    // and process it
    QRectF crect = selectionRect();
    emit updateRequest(crect);

    d->cursor.setPosition(newCursor.selectionStart());
    d->cursor.setPosition(newCursor.selectionEnd(), QTextCursor::KeepAnchor);
    d->cursorIsFocusIndicator = true;

    crect = selectionRect();
    emit updateRequest(crect);
    emit visibilityRequest(crect);
    return true;
}